

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

DdNode * Ivy_FraigNodesAreEquivBdd_int(DdManager *dd,DdNode *bFunc,Vec_Ptr_t *vFront,int Level)

{
  uint *puVar1;
  undefined8 uVar2;
  void **ppvVar3;
  uint uVar4;
  uint *__ptr;
  void *pvVar5;
  void *pvVar6;
  DdNode **vector;
  DdNode *pDVar7;
  DdNode *pDVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar5 = malloc(800);
  *(void **)(__ptr + 2) = pvVar5;
  iVar10 = vFront->nSize;
  if (iVar10 < 1) {
    uVar18 = 0;
  }
  else {
    uVar18 = 0;
    uVar13 = 100;
    uVar15 = 100;
    lVar17 = 0;
    uVar14 = 100;
    do {
      pvVar5 = vFront->pArray[lVar17];
      if (*(uint *)((long)pvVar5 + 8) >> 0xb == Level) {
        uVar11 = *(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe;
        uVar16 = uVar14;
        uVar14 = uVar13;
        if ((*(uint *)(uVar11 + 8) & 0x20) == 0) {
          *(uint *)(uVar11 + 8) = *(uint *)(uVar11 + 8) | 0x20;
          *(uint *)(uVar11 + 4) = uVar18;
          uVar12 = (uint)uVar15;
          if (uVar18 == uVar12) {
            if ((int)uVar12 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc(0x80);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = 0x10;
              uVar13 = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar12 = uVar12 * 2;
              uVar16 = (ulong)uVar12;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc(uVar16 * 8);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),uVar16 * 8);
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = uVar12;
              uVar13 = (ulong)uVar12;
            }
          }
          else {
            pvVar6 = *(void **)(__ptr + 2);
            uVar16 = uVar15;
          }
          lVar9 = (long)(int)uVar18;
          uVar18 = uVar18 + 1;
          __ptr[1] = uVar18;
          *(ulong *)((long)pvVar6 + lVar9 * 8) = uVar11;
          uVar14 = uVar13;
          uVar15 = uVar16;
        }
        pvVar5 = (void *)(*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffffe);
        uVar13 = uVar14;
        if ((*(uint *)((long)pvVar5 + 8) & 0x20) == 0) {
          *(uint *)((long)pvVar5 + 8) = *(uint *)((long)pvVar5 + 8) | 0x20;
          *(uint *)((long)pvVar5 + 4) = uVar18;
          uVar12 = (uint)uVar14;
          if (uVar18 == uVar12) {
            if ((int)uVar12 < 0x10) goto LAB_007a5c19;
            uVar12 = uVar12 * 2;
            uVar14 = (ulong)uVar12;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(uVar14 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = uVar12;
            uVar15 = (ulong)uVar12;
            uVar13 = uVar14;
          }
          else {
            pvVar6 = *(void **)(__ptr + 2);
            uVar15 = uVar14;
          }
          goto LAB_007a5ca6;
        }
      }
      else {
        *(uint *)((long)pvVar5 + 8) = *(uint *)((long)pvVar5 + 8) | 0x20;
        *(uint *)((long)pvVar5 + 4) = uVar18;
        uVar12 = (uint)uVar14;
        if (uVar18 == uVar12) {
          if ((int)uVar12 < 0x10) {
LAB_007a5c19:
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = 0x10;
            uVar14 = 0x10;
            uVar15 = 0x10;
            uVar13 = uVar14;
          }
          else {
            uVar12 = uVar12 * 2;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar12 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar12 * 8);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = uVar12;
            uVar14 = (ulong)uVar12;
            uVar15 = (ulong)uVar12;
            uVar13 = uVar14;
          }
        }
        else {
          pvVar6 = *(void **)(__ptr + 2);
        }
LAB_007a5ca6:
        lVar9 = (long)(int)uVar18;
        uVar18 = uVar18 + 1;
        __ptr[1] = uVar18;
        *(void **)((long)pvVar6 + lVar9 * 8) = pvVar5;
        uVar16 = uVar14;
      }
      lVar17 = lVar17 + 1;
      iVar10 = vFront->nSize;
      uVar14 = uVar16;
    } while (lVar17 < iVar10);
  }
  uVar12 = dd->size;
  uVar4 = uVar18;
  if ((int)uVar18 < (int)uVar12) {
    uVar4 = uVar12;
  }
  vector = (DdNode **)malloc((long)(int)uVar4 << 3);
  if (0 < iVar10) {
    lVar17 = 0;
    do {
      pvVar5 = vFront->pArray[lVar17];
      if (*(uint *)((long)pvVar5 + 8) >> 0xb == Level) {
        pDVar7 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) +
                                           4));
        uVar2 = *(undefined8 *)((long)pvVar5 + 0x10);
        pDVar8 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffffe) +
                                           4));
        pDVar7 = Cudd_bddAnd(dd,(DdNode *)((ulong)((uint)uVar2 & 1) ^ (ulong)pDVar7),
                             (DdNode *)
                             ((ulong)((uint)*(undefined8 *)((long)pvVar5 + 0x18) & 1) ^
                             (ulong)pDVar8));
      }
      else {
        pDVar7 = Cudd_bddIthVar(dd,*(int *)((long)pvVar5 + 4));
      }
      vector[lVar17] = pDVar7;
      Cudd_Ref(pDVar7);
      lVar17 = lVar17 + 1;
      iVar10 = vFront->nSize;
    } while (lVar17 < iVar10);
    uVar12 = dd->size;
  }
  if (uVar4 != uVar12) {
    __assert_fail("NewSize == dd->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFraig.c"
                  ,0xaaa,
                  "DdNode *Ivy_FraigNodesAreEquivBdd_int(DdManager *, DdNode *, Vec_Ptr_t *, int)");
  }
  if (iVar10 < (int)uVar4) {
    lVar17 = (long)iVar10;
    do {
      pDVar7 = Cudd_bddIthVar(dd,(int)lVar17);
      vector[lVar17] = pDVar7;
      Cudd_Ref(pDVar7);
      lVar17 = lVar17 + 1;
    } while (lVar17 < dd->size);
  }
  pDVar7 = Cudd_bddVectorCompose(dd,bFunc,vector);
  Cudd_Ref(pDVar7);
  if (0 < (int)uVar18) {
    lVar17 = *(long *)(__ptr + 2);
    uVar14 = 0;
    do {
      lVar9 = *(long *)(lVar17 + uVar14 * 8);
      puVar1 = (uint *)(lVar9 + 8);
      *puVar1 = *puVar1 & 0xffffffdf;
      *(undefined4 *)(lVar9 + 4) = 0;
      uVar14 = uVar14 + 1;
    } while (uVar18 != uVar14);
  }
  if (dd->size < 1) {
    if (vector == (DdNode **)0x0) goto LAB_007a5e43;
  }
  else {
    lVar17 = 0;
    do {
      Cudd_RecursiveDeref(dd,vector[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < dd->size);
  }
  free(vector);
LAB_007a5e43:
  if (vFront->pArray != (void **)0x0) {
    free(vFront->pArray);
  }
  uVar18 = __ptr[1];
  ppvVar3 = *(void ***)(__ptr + 2);
  vFront->nCap = __ptr[0];
  vFront->nSize = uVar18;
  vFront->pArray = ppvVar3;
  free(__ptr);
  Cudd_Deref(pDVar7);
  return pDVar7;
}

Assistant:

DdNode * Ivy_FraigNodesAreEquivBdd_int( DdManager * dd, DdNode * bFunc, Vec_Ptr_t * vFront, int Level )
{
    DdNode ** pFuncs;
    DdNode * bFuncNew;
    Vec_Ptr_t * vTemp;
    Ivy_Obj_t * pObj, * pFanin;
    int i, NewSize;
    // create new frontier
    vTemp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
        {
            pObj->fMarkB = 1;
            pObj->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pObj );
            continue;
        }

        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }
    }
    // collect the permutation
    NewSize = IVY_MAX(dd->size, Vec_PtrSize(vTemp));
    pFuncs = ABC_ALLOC( DdNode *, NewSize );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
            pFuncs[i] = Cudd_bddIthVar( dd, pObj->TravId );
        else
            pFuncs[i] = Cudd_bddAnd( dd, 
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin0(pObj)->TravId), Ivy_ObjFaninC0(pObj) ),
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ) );
        Cudd_Ref( pFuncs[i] );
    }
    // add the remaining vars
    assert( NewSize == dd->size );
    for ( i = Vec_PtrSize(vFront); i < dd->size; i++ )
    {
        pFuncs[i] = Cudd_bddIthVar( dd, i );
        Cudd_Ref( pFuncs[i] );
    }

    // create new
    bFuncNew = Cudd_bddVectorCompose( dd, bFunc, pFuncs ); Cudd_Ref( bFuncNew );
    // clean trav Id
    Vec_PtrForEachEntry( Ivy_Obj_t *, vTemp, pObj, i )
    {
        pObj->fMarkB = 0;
        pObj->TravId = 0;
    }
    // deref
    for ( i = 0; i < dd->size; i++ )
        Cudd_RecursiveDeref( dd, pFuncs[i] );
    ABC_FREE( pFuncs );

    ABC_FREE( vFront->pArray );
    *vFront = *vTemp;

    vTemp->nCap = vTemp->nSize = 0;
    vTemp->pArray = NULL;
    Vec_PtrFree( vTemp );

    Cudd_Deref( bFuncNew );
    return bFuncNew;
}